

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockTests.cpp
# Opt level: O2

void __thiscall
vkt::ubo::anon_unknown_0::LinkByBindingCase::LinkByBindingCase
          (LinkByBindingCase *this,TestContext *testCtx,string *name,string *description,
          BufferMode bufferMode,int numInstances)

{
  ShaderInterface *this_00;
  vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_> *pvVar1;
  UniformBlock *pUVar2;
  UniformBlock *pUVar3;
  allocator<char> local_a1;
  VarType local_a0;
  string local_88;
  Uniform local_68;
  
  UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,testCtx,name,description,bufferMode,LOAD_FULL_MATRIX,
             false);
  (this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformBlockCase_00bd5450;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"TestBlock",(allocator<char> *)&local_88);
  this_00 = &(this->super_UniformBlockCase).m_interface;
  pUVar2 = ShaderInterface::allocBlock(this_00,&local_68.m_name);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"a",&local_a1);
  VarType::VarType(&local_a0,TYPE_FLOAT,4);
  Uniform::Uniform(&local_68,&local_88,&local_a0,0);
  pvVar1 = &pUVar2->m_uniforms;
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_68);
  Uniform::~Uniform(&local_68);
  VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"b",&local_a1);
  VarType::VarType(&local_a0,TYPE_UINT_VEC3,1);
  Uniform::Uniform(&local_68,&local_88,&local_a0,0x1800);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_68);
  Uniform::~Uniform(&local_68);
  VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"c",&local_a1);
  VarType::VarType(&local_a0,TYPE_FLOAT_MAT2,2);
  Uniform::Uniform(&local_68,&local_88,&local_a0,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_68);
  Uniform::~Uniform(&local_68);
  VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  pUVar2->m_flags = 0x220;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"TestBlock",(allocator<char> *)&local_88);
  pUVar3 = ShaderInterface::allocBlock(this_00,&local_68.m_name);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"a",&local_a1);
  VarType::VarType(&local_a0,TYPE_FLOAT_MAT3,2);
  Uniform::Uniform(&local_68,&local_88,&local_a0,0);
  pvVar1 = &pUVar3->m_uniforms;
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_68);
  Uniform::~Uniform(&local_68);
  VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"b",&local_a1);
  VarType::VarType(&local_a0,TYPE_INT_VEC2,1);
  Uniform::Uniform(&local_68,&local_88,&local_a0,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_68);
  Uniform::~Uniform(&local_68);
  VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"c",&local_a1);
  VarType::VarType(&local_a0,TYPE_FLOAT_VEC4,4);
  Uniform::Uniform(&local_68,&local_88,&local_a0,0x1800);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_68);
  Uniform::~Uniform(&local_68);
  VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"d",&local_a1);
  VarType::VarType(&local_a0,TYPE_BOOL,0);
  Uniform::Uniform(&local_68,&local_88,&local_a0,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_68);
  Uniform::~Uniform(&local_68);
  VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  pUVar3->m_flags = 0x420;
  if (0 < numInstances) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"testBlock",(allocator<char> *)&local_88);
    std::__cxx11::string::_M_assign((string *)&pUVar2->m_instanceName);
    std::__cxx11::string::~string((string *)&local_68);
    pUVar2->m_arraySize = numInstances;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"testBlock",(allocator<char> *)&local_88);
    std::__cxx11::string::_M_assign((string *)&pUVar3->m_instanceName);
    std::__cxx11::string::~string((string *)&local_68);
    pUVar3->m_arraySize = numInstances;
  }
  (*(this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])
            (this);
  return;
}

Assistant:

LinkByBindingCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, BufferMode bufferMode, int numInstances)
		: UniformBlockCase	(testCtx, name, description, bufferMode, LOAD_FULL_MATRIX)
	{
		UniformBlock& blockA = m_interface.allocBlock("TestBlock");
		blockA.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT, PRECISION_HIGH)));
		blockA.addUniform(Uniform("b", VarType(glu::TYPE_UINT_VEC3, PRECISION_LOW), UNUSED_BOTH));
		blockA.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_MAT2, PRECISION_MEDIUM)));
		blockA.setFlags(LAYOUT_STD140|DECLARE_VERTEX);

		UniformBlock& blockB = m_interface.allocBlock("TestBlock");
		blockB.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM)));
		blockB.addUniform(Uniform("b", VarType(glu::TYPE_INT_VEC2, PRECISION_LOW)));
		blockB.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH));
		blockB.addUniform(Uniform("d", VarType(glu::TYPE_BOOL, 0)));
		blockB.setFlags(LAYOUT_STD140|DECLARE_FRAGMENT);

		if (numInstances > 0)
		{
			blockA.setInstanceName("testBlock");
			blockA.setArraySize(numInstances);
			blockB.setInstanceName("testBlock");
			blockB.setArraySize(numInstances);
		}

		init();
	}